

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2_p.h
# Opt level: O2

void __thiscall QGles2CommandBuffer::resetCommands(QGles2CommandBuffer *this)

{
  (this->commands).p = 0;
  QVLABase<QByteArray>::clear(&(this->dataRetainPool).super_QVLABase<QByteArray>);
  QVLABase<QRhiBufferData>::clear(&(this->bufferDataRetainPool).super_QVLABase<QRhiBufferData>);
  QVLABase<QImage>::clear(&(this->imageRetainPool).super_QVLABase<QImage>);
  QVLABase<QRhiPassResourceTracker>::clear
            (&(this->passResTrackers).super_QVLABase<QRhiPassResourceTracker>);
  this->currentPassResTrackerIndex = -1;
  return;
}

Assistant:

void resetCommands() {
        commands.reset();
        dataRetainPool.clear();
        bufferDataRetainPool.clear();
        imageRetainPool.clear();

        passResTrackers.clear();
        currentPassResTrackerIndex = -1;
    }